

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_decode_from_hex_Test::TestBody
          (HexEncoderTest_test_decode_from_hex_Test *this)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertHelper local_100;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  long local_e8;
  AssertionResult local_e0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  long *local_30 [2];
  long local_20 [2];
  
  local_100.data_._0_1_ = 0x23;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"23","");
  bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_f8,local_30);
  if (local_f0 == local_f8.ptr_) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001972bd:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001972cf:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001972e1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&local_e0,"(unsigned char) 35","HexEncoder::DecodeFromHex(\"23\").at(0)",
               (uchar *)&local_100,(uchar *)local_f8.ptr_);
    if (local_f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_f8.ptr_,local_e8 - (long)local_f8.ptr_);
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    bVar1 = local_e0.success_;
    if (local_e0.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x2d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar1 == false) {
      return;
    }
    local_100.data_._0_1_ = 0;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"00","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_f8,local_50);
    if (local_f0 == local_f8.ptr_) goto LAB_001972bd;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&local_e0,"(unsigned char) 0","HexEncoder::DecodeFromHex(\"00\").at(0)",
               (uchar *)&local_100,(uchar *)local_f8.ptr_);
    if (local_f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_f8.ptr_,local_e8 - (long)local_f8.ptr_);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    bVar1 = local_e0.success_;
    if (local_e0.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x2e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar1 == false) {
      return;
    }
    local_100.data_._0_1_ = 0x56;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"56","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_f8,local_70);
    if (local_f0 == local_f8.ptr_) goto LAB_001972cf;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&local_e0,"(unsigned char) 86","HexEncoder::DecodeFromHex(\"56\").at(0)",
               (uchar *)&local_100,(uchar *)local_f8.ptr_);
    if (local_f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_f8.ptr_,local_e8 - (long)local_f8.ptr_);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    bVar1 = local_e0.success_;
    if (local_e0.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x2f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar1 == false) {
      return;
    }
    local_100.data_._0_1_ = 0x69;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"69","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_f8,local_90);
    if (local_f0 == local_f8.ptr_) goto LAB_001972e1;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&local_e0,"(unsigned char) 105","HexEncoder::DecodeFromHex(\"69\").at(0)"
               ,(uchar *)&local_100,(uchar *)local_f8.ptr_);
    if (local_f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_f8.ptr_,local_e8 - (long)local_f8.ptr_);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    bVar1 = local_e0.success_;
    if (local_e0.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x30,pcVar4);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar1 == false) {
      return;
    }
    local_100.data_._0_1_ = 0x5b;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"5B","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_f8,local_b0);
    if (local_f0 != local_f8.ptr_) {
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)&local_e0,"(unsigned char) 91",
                 "HexEncoder::DecodeFromHex(\"5B\").at(0)",(uchar *)&local_100,
                 (uchar *)local_f8.ptr_);
      if (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_f8.ptr_,local_e8 - (long)local_f8.ptr_);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      bVar1 = local_e0.success_;
      if (local_e0.success_ == false) {
        testing::Message::Message((Message *)&local_f8);
        if (local_e0.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x31,pcVar4);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (((local_f8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_f8.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_e0.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (bVar1 == false) {
        return;
      }
      local_100.data_._0_1_ = 0x79;
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"79","");
      bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_f8,local_d0);
      if (local_f0 != local_f8.ptr_) {
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)&local_e0,"(unsigned char) 121",
                   "HexEncoder::DecodeFromHex(\"79\").at(0)",(uchar *)&local_100,
                   (uchar *)local_f8.ptr_);
        if (local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(local_f8.ptr_,local_e8 - (long)local_f8.ptr_);
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if (local_e0.success_ == false) {
          testing::Message::Message((Message *)&local_f8);
          if (local_e0.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x32,pcVar4);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          testing::Message::~Message((Message *)&local_f8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_e0.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      goto LAB_00197305;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00197305:
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::Message::~Message((Message *)&local_f8);
  testing::AssertionResult::~AssertionResult(&local_e0);
  _Unwind_Resume(uVar3);
}

Assistant:

TEST(HexEncoderTest, test_decode_from_hex)
{
    ASSERT_EQ((unsigned char) 35, HexEncoder::DecodeFromHex("23").at(0));
    ASSERT_EQ((unsigned char) 0, HexEncoder::DecodeFromHex("00").at(0));
    ASSERT_EQ((unsigned char) 86, HexEncoder::DecodeFromHex("56").at(0));
    ASSERT_EQ((unsigned char) 105, HexEncoder::DecodeFromHex("69").at(0));
    ASSERT_EQ((unsigned char) 91, HexEncoder::DecodeFromHex("5B").at(0));
    ASSERT_EQ((unsigned char) 121, HexEncoder::DecodeFromHex("79").at(0));
}